

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_end.c
# Opt level: O2

void arg_print_errors_ds(arg_dstr_t ds,arg_end *end,char *progname)

{
  code *pcVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 < end->count; lVar2 = lVar2 + 1) {
    pcVar1 = *(code **)((long)end->parent[lVar2] + 0x50);
    if (pcVar1 != (code *)0x0) {
      (*pcVar1)(end->parent[lVar2],ds,end->error[lVar2],end->argval[lVar2],progname);
    }
  }
  return;
}

Assistant:

void arg_print_errors_ds(arg_dstr_t ds, struct arg_end* end, const char* progname) {
    int i;
    ARG_TRACE(("arg_errors()\n"));
    for (i = 0; i < end->count; i++) {
        struct arg_hdr* errorparent = (struct arg_hdr*)(end->parent[i]);
        if (errorparent->errorfn)
            errorparent->errorfn(end->parent[i], ds, end->error[i], end->argval[i], progname);
    }
}